

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

int ws_listener_set(void *arg,char *name,void *buf,size_t sz,nni_type t)

{
  int iVar1;
  int local_3c;
  int rv;
  nni_ws_listener *l;
  nni_type t_local;
  size_t sz_local;
  void *buf_local;
  char *name_local;
  void *arg_local;
  
  local_3c = nni_setopt(ws_listener_options,name,arg,buf,sz,t);
  if (local_3c == 9) {
    local_3c = nni_http_server_set(*(nni_http_server **)((long)arg + 0x50),name,buf,sz,t);
  }
  if ((local_3c == 9) && (iVar1 = strncmp(name,"ws:header:",10), iVar1 == 0)) {
    local_3c = ws_listener_set_header((nni_ws_listener *)arg,name,buf,sz,t);
  }
  return local_3c;
}

Assistant:

static int
ws_listener_set(
    void *arg, const char *name, const void *buf, size_t sz, nni_type t)
{
	nni_ws_listener *l = arg;
	int              rv;

	rv = nni_setopt(ws_listener_options, name, l, buf, sz, t);
	if (rv == NNG_ENOTSUP) {
		rv = nni_http_server_set(l->server, name, buf, sz, t);
	}

	if (rv == NNG_ENOTSUP) {
		if (startswith(name, NNG_OPT_WS_HEADER)) {
			rv = ws_listener_set_header(l, name, buf, sz, t);
		}
	}
	return (rv);
}